

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

ParseArgumentStatus __thiscall
google::protobuf::compiler::CommandLineInterface::ParseArguments
          (CommandLineInterface *this,int argc,char **argv)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  char *pcVar1;
  pointer pbVar2;
  pointer pbVar3;
  CommandLineInterface *pCVar4;
  bool bVar5;
  int iVar6;
  ParseArgumentStatus PVar7;
  ostream *poVar8;
  size_type sVar9;
  long lVar10;
  char *pcVar11;
  ParseArgumentStatus unaff_R13D;
  int iVar12;
  string value;
  string name;
  string local_a0;
  CommandLineInterface *local_80;
  char **local_78;
  undefined1 local_70 [32];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pcVar11 = *argv;
  pcVar1 = (char *)(this->executable_name_)._M_string_length;
  local_78 = argv;
  strlen(pcVar11);
  local_80 = this;
  std::__cxx11::string::_M_replace((ulong)this,0,pcVar1,(ulong)pcVar11);
  if (1 < argc) {
    iVar12 = 1;
    do {
      local_70._0_8_ = local_70 + 0x10;
      local_70._8_8_ = 0;
      local_70[0x10] = '\0';
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      local_a0._M_string_length = 0;
      local_a0.field_2._M_local_buf[0] = '\0';
      bVar5 = ParseArgument(this,local_78[iVar12],(string *)local_70,&local_a0);
      sVar9 = local_a0._M_string_length;
      if (bVar5) {
        iVar6 = iVar12 + 1;
        if ((iVar6 != argc) && (pcVar11 = local_78[iVar6], *pcVar11 != '-')) {
          strlen(pcVar11);
          std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)sVar9,(ulong)pcVar11);
          iVar12 = iVar6;
          goto LAB_0018053e;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Missing value for flag: ",0x18);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_70._0_8_,local_70._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        iVar6 = std::__cxx11::string::compare(local_70);
        if (iVar6 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"To decode an unknown message, use --decode_raw.",0x2f);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x18);
          std::ostream::put(-0x18);
          std::ostream::flush();
        }
        bVar5 = false;
        unaff_R13D = PARSE_ARGUMENT_FAIL;
      }
      else {
LAB_0018053e:
        PVar7 = InterpretArgument(local_80,(string *)local_70,&local_a0);
        bVar5 = PVar7 == PARSE_ARGUMENT_DONE_AND_CONTINUE;
        if (!bVar5) {
          unaff_R13D = PVar7;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,
                        CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                 local_a0.field_2._M_local_buf[0]) + 1);
      }
      this = (CommandLineInterface *)local_70._0_8_;
      if ((CommandLineInterface *)local_70._0_8_ != (CommandLineInterface *)(local_70 + 0x10)) {
        operator_delete((void *)local_70._0_8_,CONCAT71(local_70._17_7_,local_70[0x10]) + 1);
      }
      if (!bVar5) {
        return unaff_R13D;
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 < argc);
  }
  pCVar4 = local_80;
  if ((local_80->proto_path_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (local_80->proto_path_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = &local_80->proto_path_;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[1],_const_char_(&)[2],_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_70,(char (*) [1])0x22c413,(char (*) [2])0x24b007);
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)this_00,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
    }
    if ((CommandLineInterface *)local_70._0_8_ != (CommandLineInterface *)(local_70 + 0x10)) {
      operator_delete((void *)local_70._0_8_,CONCAT71(local_70._17_7_,local_70[0x10]) + 1);
    }
  }
  if (pCVar4->mode_ == MODE_DECODE) {
    pbVar2 = (pCVar4->input_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (pCVar4->input_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((pCVar4->codec_type_)._M_string_length == 0) {
      if (pbVar2 != pbVar3) {
        pcVar11 = "When using --decode_raw, no input files should be given.";
        lVar10 = 0x38;
        goto LAB_001806eb;
      }
    }
    else if (pbVar2 == pbVar3) goto LAB_001806be;
  }
  else {
    if ((pCVar4->input_files_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pCVar4->input_files_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001806be:
      pcVar11 = "Missing input file.";
      lVar10 = 0x13;
LAB_001806eb:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar11,lVar10);
      PVar7 = PARSE_ARGUMENT_FAIL;
      goto LAB_00180788;
    }
    if (((pCVar4->mode_ == MODE_COMPILE) &&
        ((pCVar4->output_directives_).
         super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (pCVar4->output_directives_).
         super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
         ._M_impl.super__Vector_impl_data._M_finish)) &&
       ((pCVar4->descriptor_set_name_)._M_string_length == 0)) {
      pcVar11 = "Missing output directives.";
      lVar10 = 0x1a;
      goto LAB_001806eb;
    }
  }
  sVar9 = (pCVar4->descriptor_set_name_)._M_string_length;
  if ((sVar9 == 0 & pCVar4->imports_in_descriptor_set_) == 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "--include_imports only makes sense when combined with --descriptor_set_out.",0x4b);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
    sVar9 = (pCVar4->descriptor_set_name_)._M_string_length;
  }
  if (pCVar4->source_info_in_descriptor_set_ != true) {
    return PARSE_ARGUMENT_DONE_AND_CONTINUE;
  }
  if (sVar9 != 0) {
    return PARSE_ARGUMENT_DONE_AND_CONTINUE;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "--include_source_info only makes sense when combined with --descriptor_set_out.",0x4f)
  ;
  PVar7 = PARSE_ARGUMENT_DONE_AND_CONTINUE;
LAB_00180788:
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  return PVar7;
}

Assistant:

CommandLineInterface::ParseArgumentStatus
CommandLineInterface::ParseArguments(int argc, const char* const argv[]) {
  executable_name_ = argv[0];

  // Iterate through all arguments and parse them.
  for (int i = 1; i < argc; i++) {
    string name, value;

    if (ParseArgument(argv[i], &name, &value)) {
      // Returned true => Use the next argument as the flag value.
      if (i + 1 == argc || argv[i+1][0] == '-') {
        cerr << "Missing value for flag: " << name << endl;
        if (name == "--decode") {
          cerr << "To decode an unknown message, use --decode_raw." << endl;
        }
        return PARSE_ARGUMENT_FAIL;
      } else {
        ++i;
        value = argv[i];
      }
    }

    ParseArgumentStatus status = InterpretArgument(name, value);
    if (status != PARSE_ARGUMENT_DONE_AND_CONTINUE)
      return status;
  }

  // If no --proto_path was given, use the current working directory.
  if (proto_path_.empty()) {
    // Don't use make_pair as the old/default standard library on Solaris
    // doesn't support it without explicit template parameters, which are
    // incompatible with C++0x's make_pair.
    proto_path_.push_back(pair<string, string>("", "."));
  }

  // Check some errror cases.
  bool decoding_raw = (mode_ == MODE_DECODE) && codec_type_.empty();
  if (decoding_raw && !input_files_.empty()) {
    cerr << "When using --decode_raw, no input files should be given." << endl;
    return PARSE_ARGUMENT_FAIL;
  } else if (!decoding_raw && input_files_.empty()) {
    cerr << "Missing input file." << endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (mode_ == MODE_COMPILE && output_directives_.empty() &&
      descriptor_set_name_.empty()) {
    cerr << "Missing output directives." << endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (imports_in_descriptor_set_ && descriptor_set_name_.empty()) {
    cerr << "--include_imports only makes sense when combined with "
            "--descriptor_set_out." << endl;
  }
  if (source_info_in_descriptor_set_ && descriptor_set_name_.empty()) {
    cerr << "--include_source_info only makes sense when combined with "
            "--descriptor_set_out." << endl;
  }

  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
}